

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seq.hpp
# Opt level: O1

Maybe<rc::Shrinkable<unsigned_long>_> __thiscall
rc::Seq<rc::Shrinkable<unsigned_long>_>::next(Seq<rc::Shrinkable<unsigned_long>_> *this)

{
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  long *in_RSI;
  Maybe<rc::Shrinkable<unsigned_long>_> MVar1;
  
  if ((undefined8 *)*in_RSI == (undefined8 *)0x0) {
    *(undefined1 *)
     &this[1].m_impl._M_t.
      super___uniq_ptr_impl<rc::Seq<rc::Shrinkable<unsigned_long>_>::ISeqImpl,_std::default_delete<rc::Seq<rc::Shrinkable<unsigned_long>_>::ISeqImpl>_>
      ._M_t.
      super__Tuple_impl<0UL,_rc::Seq<rc::Shrinkable<unsigned_long>_>::ISeqImpl_*,_std::default_delete<rc::Seq<rc::Shrinkable<unsigned_long>_>::ISeqImpl>_>
      .super__Head_base<0UL,_rc::Seq<rc::Shrinkable<unsigned_long>_>::ISeqImpl_*,_false>.
      _M_head_impl = 0;
  }
  else {
    (*(code *)**(undefined8 **)*in_RSI)(this);
    in_RDX = extraout_RDX;
  }
  MVar1._8_8_ = in_RDX;
  MVar1.m_storage = (Storage)this;
  return MVar1;
}

Assistant:

Maybe<T> Seq<T>::next() noexcept {
  try {
    return m_impl ? m_impl->next() : Nothing;
  } catch (...) {
    m_impl.reset();
    return Nothing;
  }
}